

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O1

int asn1_i2d_ex_primitive
              (ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass,int optional)

{
  uint length;
  uint uVar1;
  int iVar2;
  int omit;
  int utype;
  int local_3c;
  int local_38;
  int local_34;
  
  local_38 = it->utype;
  local_34 = aclass;
  length = asn1_ex_i2c((ASN1_VALUE **)pval,(uchar *)0x0,&local_3c,(ASN1_ITEM *)&local_38);
  iVar2 = local_38;
  uVar1 = 0xffffffff;
  if (-1 < (int)length) {
    if (local_3c == 0) {
      if (tag == -1) {
        tag = local_38;
      }
      if (out != (uchar **)0x0) {
        if ((0x14 < local_38 + 3U) || ((0x180001U >> (local_38 + 3U & 0x1f) & 1) == 0)) {
          ASN1_put_object(out,0,length,tag,local_34);
        }
        uVar1 = asn1_ex_i2c((ASN1_VALUE **)pval,*out,&local_3c,(ASN1_ITEM *)&local_38);
        if ((int)uVar1 < 0) {
          return -1;
        }
        if (length != uVar1) {
          __assert_fail("len == len2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x1ed,
                        "int asn1_i2d_ex_primitive(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                       );
        }
        if (local_3c != 0) {
          __assert_fail("!omit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                        ,0x1ee,
                        "int asn1_i2d_ex_primitive(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                       );
        }
        *out = *out + length;
      }
      if ((0x14 < iVar2 + 3U) || (uVar1 = length, (0x180001U >> (iVar2 + 3U & 0x1f) & 1) == 0)) {
        iVar2 = ASN1_object_size(0,length,tag);
        return iVar2;
      }
    }
    else {
      uVar1 = 0;
      if (optional == 0) {
        ERR_put_error(0xc,0,0x9b,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x1d5);
        uVar1 = 0xffffffff;
      }
    }
  }
  return uVar1;
}

Assistant:

static int asn1_i2d_ex_primitive(ASN1_VALUE **pval, unsigned char **out,
                                 const ASN1_ITEM *it, int tag, int aclass,
                                 int optional) {
  // Get length of content octets and maybe find out the underlying type.
  int omit;
  int utype = it->utype;
  int len = asn1_ex_i2c(pval, NULL, &omit, &utype, it);
  if (len < 0) {
    return -1;
  }
  if (omit) {
    if (optional) {
      return 0;
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  // If SEQUENCE, SET or OTHER then header is included in pseudo content
  // octets so don't include tag+length. We need to check here because the
  // call to asn1_ex_i2c() could change utype.
  int usetag =
      utype != V_ASN1_SEQUENCE && utype != V_ASN1_SET && utype != V_ASN1_OTHER;

  // If not implicitly tagged get tag from underlying type
  if (tag == -1) {
    tag = utype;
  }

  // Output tag+length followed by content octets
  if (out) {
    if (usetag) {
      ASN1_put_object(out, /*constructed=*/0, len, tag, aclass);
    }
    int len2 = asn1_ex_i2c(pval, *out, &omit, &utype, it);
    if (len2 < 0) {
      return -1;
    }
    assert(len == len2);
    assert(!omit);
    *out += len;
  }

  if (usetag) {
    return ASN1_object_size(/*constructed=*/0, len, tag);
  }
  return len;
}